

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

PropertySym * __thiscall
GlobOpt::CopyPropPropertySymObj(GlobOpt *this,SymOpnd *symOpnd,Instr *instr)

{
  anon_union_1_2_e896908e_for_anon_struct_2_6_3cd4a9f4_for_anon_union_2_2_18881db1_for_PropertySymOpnd_13_0_5
  *paVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  PropertySym *propertySym;
  Value *pVVar7;
  StackSym *copySym;
  PropertySym *propertySym_00;
  PropertySymOpnd *this_00;
  StackSym *pSVar8;
  JsTypeValueInfo *valueInfo;
  Sym *this_01;
  GlobOpt *this_02;
  
  this_01 = symOpnd->m_sym;
  if (this_01->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x7a9,"(symOpnd->m_sym->IsPropertySym())","symOpnd->m_sym->IsPropertySym()")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    this_01 = symOpnd->m_sym;
  }
  propertySym = Sym::AsPropertySym(this_01);
  pSVar8 = propertySym->m_stackSym;
  pVVar7 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
  propertySym_00 = propertySym;
  if (pVVar7 != (Value *)0x0) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ObjPtrCopyPropPhase,uVar4,uVar5);
    if ((!bVar3) &&
       (copySym = GlobOptBlockData::GetCopyPropSym
                            (&this->currentBlock->globOptData,&pSVar8->super_Sym,pVVar7),
       copySym != (StackSym *)0x0)) {
      propertySym_00 =
           PropertySym::FindOrCreate
                     ((copySym->super_Sym).m_id,propertySym->m_propertyId,
                      propertySym->m_propertyIdIndex,propertySym->m_inlineCacheIndex,
                      (propertySym->super_Sym).field_0x15,this->func);
      if ((this->prePassLoop == (Loop *)0x0) ||
         (bVar3 = SafeToCopyPropInPrepass(this,pSVar8,copySym,pVVar7), bVar3)) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar4,uVar5);
        if (bVar3) {
          Output::Print(L"TRACE: ");
          IR::Opnd::Dump(&symOpnd->super_Opnd);
          Output::Print(L" : ");
          Output::Print(L"Copy prop obj ptr s%d, new property: ",(ulong)(copySym->super_Sym).m_id);
          Sym::Dump(&propertySym_00->super_Sym,(ValueType)0x9);
          Output::Print(L"\n");
        }
        this_02 = this;
        CaptureByteCodeSymUses(this,instr);
        bVar3 = IsPropertySymPreparedForTypeCheckSeq(this_02,propertySym);
        if (bVar3) {
          PreparePropertySymForTypeCheckSeq(this,propertySym_00);
        }
        symOpnd->m_sym = &propertySym_00->super_Sym;
        IR::Opnd::SetIsJITOptimizedReg(&symOpnd->super_Opnd,true);
        bVar3 = IR::SymOpnd::IsPropertySymOpnd(symOpnd);
        if (bVar3) {
          this_00 = IR::Opnd::AsPropertySymOpnd(&symOpnd->super_Opnd);
          bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_00);
          if (bVar3) {
            pSVar8 = StackSym::GetObjectTypeSym(copySym);
            pVVar7 = GlobOptBlockData::FindObjectTypeValueNoLivenessCheck
                               (&this->currentBlock->globOptData,pSVar8);
            if (pVVar7 == (Value *)0x0) {
              valueInfo = (JsTypeValueInfo *)0x0;
            }
            else {
              valueInfo = ValueInfo::AsJsType(pVVar7->valueInfo);
            }
            bVar3 = CompareCurrentTypesWithExpectedTypes(valueInfo,this_00);
            if (!bVar3) {
              paVar1 = &(this_00->field_12).field_0.field_5;
              paVar1->typeCheckSeqFlags = paVar1->typeCheckSeqFlags & 0xfe;
            }
          }
          IR::PropertySymOpnd::SetTypeDeadIfTypeCheckSeqCandidate(this_00,false);
        }
        if (this->prePassLoop != (Loop *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->prePassCopyPropSym,(copySym->super_Sym).m_id);
        }
      }
      if ((instr->m_dst != (Opnd *)0x0) &&
         (bVar3 = IR::Opnd::IsEqual(&symOpnd->super_Opnd,instr->m_dst), bVar3)) {
        ToVarUses(this,instr,&symOpnd->super_Opnd,true,(Value *)0x0);
      }
    }
  }
  return propertySym_00;
}

Assistant:

PropertySym *
GlobOpt::CopyPropPropertySymObj(IR::SymOpnd *symOpnd, IR::Instr *instr)
{
    Assert(symOpnd->m_sym->IsPropertySym());

    PropertySym *propertySym = symOpnd->m_sym->AsPropertySym();

    StackSym *objSym = propertySym->m_stackSym;

    Value * val = this->currentBlock->globOptData.FindValue(objSym);

    if (val && !PHASE_OFF(Js::ObjPtrCopyPropPhase, this->func))
    {
        StackSym *copySym = this->currentBlock->globOptData.GetCopyPropSym(objSym, val);
        if (copySym != nullptr)
        {
            PropertySym *newProp = PropertySym::FindOrCreate(
                copySym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->func);

            if (!this->IsLoopPrePass() || SafeToCopyPropInPrepass(objSym, copySym, val))
            {
#if DBG_DUMP
                if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
                {
                    Output::Print(_u("TRACE: "));
                    symOpnd->Dump();
                    Output::Print(_u(" : "));
                    Output::Print(_u("Copy prop obj ptr s%d, new property: "), copySym->m_id);
                    newProp->Dump();
                    Output::Print(_u("\n"));
                }
#endif

                // Copy prop
                this->CaptureByteCodeSymUses(instr);

                // If the old sym was part of an object type spec type check sequence,
                // let's make sure the new one is prepped for it as well.
                if (IsPropertySymPreparedForTypeCheckSeq(propertySym))
                {
                    PreparePropertySymForTypeCheckSeq(newProp);
                }
                symOpnd->m_sym = newProp;
                symOpnd->SetIsJITOptimizedReg(true);

                if (symOpnd->IsPropertySymOpnd())
                {
                    IR::PropertySymOpnd *propertySymOpnd = symOpnd->AsPropertySymOpnd();

                    if (propertySymOpnd->IsTypeCheckSeqCandidate())
                    {
                        // If the new pointer sym's expected type(s) don't match those in the inline-cache-based data for this access,
                        // we probably have a mismatch and can't safely objtypespec. If the saved objtypespecfldinfo isn't right for
                        // the new type, then we'll do an incorrect property access.
                        StackSym * newTypeSym = copySym->GetObjectTypeSym();
                        Value * newValue = currentBlock->globOptData.FindObjectTypeValueNoLivenessCheck(newTypeSym);
                        JsTypeValueInfo * newValueInfo = newValue ? newValue->GetValueInfo()->AsJsType() : nullptr;
                        bool shouldOptimize = CompareCurrentTypesWithExpectedTypes(newValueInfo, propertySymOpnd);
                        if (!shouldOptimize)
                        {
                            // We would like just to force a new type check here and keep optimizing, but downstream
                            // objtypespecfldinfo may have slot indices based on the old type.
                            propertySymOpnd->SetTypeCheckSeqCandidate(false);
                        }
                    }

                    // This is no longer strictly necessary, since we don't set the type dead bits in the initial
                    // backward pass, but let's keep it around for now in case we choose to revert to the old model.
                    propertySymOpnd->SetTypeDeadIfTypeCheckSeqCandidate(false);
                }

                if (this->IsLoopPrePass())
                {
                    this->prePassCopyPropSym->Set(copySym->m_id);
                }
            }
            propertySym = newProp;

            if(instr->GetDst() && symOpnd->IsEqual(instr->GetDst()))
            {
                // Make sure any stack sym uses in the new destination property sym are unspecialized
                instr = ToVarUses(instr, symOpnd, true, nullptr);
            }
        }
    }

    return propertySym;
}